

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

void __thiscall QAbstractSpinBoxPrivate::updateEdit(QAbstractSpinBoxPrivate *this)

{
  QVariant *pQVar1;
  undefined2 uVar2;
  QWidget *this_00;
  char16_t *pcVar3;
  long lVar4;
  int length;
  char cVar5;
  int iVar6;
  bool bVar7;
  P _a;
  long lVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype local_88;
  QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> local_80;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->type == UnknownType) goto LAB_0047b955;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar1 = &this->value;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  cVar5 = ::QVariant::equals(pQVar1);
  if ((cVar5 == '\0') ||
     (pcVar3 = (char16_t *)(this->specialValueText).d.size, pcVar3 == (char16_t *)0x0)) {
    (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xd8))(&local_98,this,pQVar1);
    local_80.a.b.d.size = local_88;
    local_80.a.b.d.ptr = pcStack_90;
    local_80.a.b.d.d = (Data *)local_98;
    local_88 = 0;
    local_80.b = &this->suffix;
    local_98 = (QArrayData *)0x0;
    pcStack_90 = (char16_t *)0x0;
    local_80.a.a = &this->prefix;
    QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&>::convertTo<QString>
              (&local_58,&local_80);
    if (&(local_80.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.a.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
  }
  else {
    local_58.d.d = (this->specialValueText).d.d;
    local_58.d.ptr = (this->specialValueText).d.ptr;
    local_58.d.size = (qsizetype)pcVar3;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QLineEdit::displayText((QString *)&local_80,this->edit);
  if ((char16_t *)local_58.d.size == local_80.a.b.d.ptr) {
    QVar9.m_data = local_58.d.ptr;
    QVar9.m_size = local_58.d.size;
    QVar10.m_data = (storage_type_conflict *)local_80.a.b.d.d;
    QVar10.m_size = local_58.d.size;
    cVar5 = QtPrivate::equalStrings(QVar9,QVar10);
    if (cVar5 == '\0') goto LAB_0047b796;
    if ((QArrayData *)local_80.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_80.a.a,2,0x10);
      }
    }
  }
  else {
LAB_0047b796:
    uVar2 = *(undefined2 *)&this->field_0x3d0;
    if ((QArrayData *)local_80.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_80.a.a,2,0x10);
      }
    }
    if (-1 < (char)uVar2) {
      QLineEdit::text((QString *)&local_80,this->edit);
      pcVar3 = local_80.a.b.d.ptr;
      if ((QArrayData *)local_80.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_80.a.a,2,0x10);
        }
      }
      iVar6 = QLineEdit::cursorPosition(this->edit);
      QLineEdit::selectedText((QString *)&local_80,this->edit);
      length = (int)local_80.a.b.d.ptr;
      if ((QArrayData *)local_80.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_80.a.a,2,0x10);
        }
      }
      bVar7 = SUB81(this->edit,0);
      QObject::blockSignals(bVar7);
      QLineEdit::setText(this->edit,&local_58);
      cVar5 = ::QVariant::equals(pQVar1);
      if ((cVar5 == '\0') || ((this->specialValueText).d.size == 0)) {
        lVar4 = (this->prefix).d.size;
        QLineEdit::displayText((QString *)&local_80,this->edit);
        lVar8 = (long)local_80.a.b.d.ptr - (this->suffix).d.size;
        if (iVar6 <= lVar8) {
          lVar8 = (long)iVar6;
        }
        if (lVar8 < lVar4) {
          lVar8 = lVar4;
        }
        iVar6 = (int)lVar8;
        if ((QArrayData *)local_80.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_80.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_80.a.a,2,0x10);
          }
        }
        if (length < 1) {
          if (pcVar3 == (char16_t *)0x0) {
            iVar6 = (int)(this->prefix).d.size;
          }
          QLineEdit::setCursorPosition(this->edit,iVar6);
        }
        else {
          QLineEdit::setSelection(this->edit,iVar6,length);
        }
      }
      QWidget::update(this_00);
      QObject::blockSignals(bVar7);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0047b955:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::updateEdit()
{
    Q_Q(QAbstractSpinBox);
    if (type == QMetaType::UnknownType)
        return;
    const QString newText = specialValue() ? specialValueText : prefix + textFromValue(value) + suffix;
    if (newText == edit->displayText() || cleared)
        return;

    const bool empty = edit->text().isEmpty();
    int cursor = edit->cursorPosition();
    int selsize = edit->selectedText().size();
    const QSignalBlocker blocker(edit);
    edit->setText(newText);

    if (!specialValue()) {
        cursor = qBound(prefix.size(), cursor, edit->displayText().size() - suffix.size());

        if (selsize > 0) {
            edit->setSelection(cursor, selsize);
        } else {
            edit->setCursorPosition(empty ? prefix.size() : cursor);
        }
    }
    q->update();
}